

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall ki::dml::Field<unsigned_int>::set_value(Field<unsigned_int> *this,FieldBase *other)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  char *pcVar5;
  value_error *this_00;
  string sStack_1b8;
  ostringstream oss;
  
  bVar1 = FieldBase::is_type<unsigned_int>(other);
  if (bVar1) {
    lVar3 = __dynamic_cast(other,&FieldBase::typeinfo,&typeinfo,0);
    this->m_value = *(uint *)(lVar3 + 0x38);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"Tried to copy value from ");
  iVar2 = (*(other->super_Serializable)._vptr_Serializable[5])(other);
  poVar4 = std::operator<<(poVar4,(char *)CONCAT44(extraout_var,iVar2));
  poVar4 = std::operator<<(poVar4," field to ");
  pcVar5 = get_type_name(this);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4," field.");
  this_00 = (value_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_00,&sStack_1b8);
  __cxa_throw(this_00,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_value(FieldBase *other) final
		{
			if (other->is_type<ValueT>())
			{
				auto *real_other = dynamic_cast<Field<ValueT> *>(other);
				set_value(real_other->get_value());
			}
			else
			{
				std::ostringstream oss;
				oss << "Tried to copy value from " <<
					other->get_type_name() << " field to " <<
					get_type_name() << " field.";
				throw value_error(oss.str());
			}
		}